

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O1

bool leveldb::GetLengthPrefixedSlice(Slice *input,Slice *result)

{
  bool bVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  uint32_t len;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = GetVarint32(input,&local_1c);
  if ((bVar1) && (uVar2 = (ulong)local_1c, uVar2 <= input->size_)) {
    result->data_ = input->data_;
    result->size_ = uVar2;
    if (input->size_ < uVar2) {
      __assert_fail("n <= size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                    ,0x46,"void leveldb::Slice::remove_prefix(size_t)");
    }
    input->data_ = input->data_ + uVar2;
    input->size_ = input->size_ - uVar2;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetLengthPrefixedSlice(Slice* input, Slice* result) {
  uint32_t len;
  if (GetVarint32(input, &len) && input->size() >= len) {
    *result = Slice(input->data(), len);
    input->remove_prefix(len);
    return true;
  } else {
    return false;
  }
}